

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_26::TapAssertionPrinter::printReconstructedExpression(TapAssertionPrinter *this)

{
  ostream *stream;
  bool bVar1;
  string expr;
  char local_32 [2];
  string local_30;
  
  bVar1 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar1) {
    stream = this->stream;
    local_30._M_dataplus._M_p = (pointer)this->colourImpl;
    local_30._M_string_length._0_4_ = 0x17;
    local_30._M_string_length._4_4_ = local_30._M_string_length._4_4_ & 0xffffff00;
    ColourImpl::ColourGuard::engageImpl((ColourGuard *)&local_30,stream);
    std::operator<<(stream," for: ");
    ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)&local_30);
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_30,this->result);
    local_32[1] = 10;
    local_32[0] = ' ';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_30._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_30._M_dataplus._M_p +
                 CONCAT44(local_30._M_string_length._4_4_,(undefined4)local_30._M_string_length)),
               local_32 + 1,local_32);
    std::operator<<(this->stream,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if (result.hasExpandedExpression()) {
                    stream << colourImpl->guardColour( tapDimColour ) << " for: ";

                    std::string expr = result.getExpandedExpression();
                    std::replace(expr.begin(), expr.end(), '\n', ' ');
                    stream << expr;
                }
            }